

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.cpp
# Opt level: O0

Fst * PDA::Utils::Defaults::fst(void)

{
  Vertex *pVVar1;
  BasicFst<wchar_t> *in_RDI;
  wchar_t in_stack_ffffffffffff9540;
  wchar_t rest_10;
  char rest_24;
  Vertex *local_6728;
  anon_class_1_0_00000001 local_60d9;
  function<void_()> local_60d8;
  Vertex local_60b8;
  anon_class_1_0_00000001 local_6079;
  function<void_()> local_6078;
  Vertex local_6058;
  anon_class_1_0_00000001 local_6019;
  function<void_()> local_6018;
  Vertex local_5ff8;
  anon_class_1_0_00000001 local_5fb9;
  function<void_()> local_5fb8;
  BasicEdge<wchar_t> local_5f98;
  int local_5f64;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5f60;
  Vertex local_5f28;
  anon_class_1_0_00000001 local_5ee9;
  function<void_()> local_5ee8;
  Vertex local_5ec8;
  anon_class_1_0_00000001 local_5e89;
  function<void_()> local_5e88;
  BasicEdge<wchar_t> local_5e68;
  int local_5e34;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5e30;
  Vertex local_5df8;
  anon_class_1_0_00000001 local_5db9;
  function<void_()> local_5db8;
  Vertex local_5d98;
  anon_class_1_0_00000001 local_5d59;
  function<void_()> local_5d58;
  Vertex local_5d38;
  anon_class_1_0_00000001 local_5cf9;
  function<void_()> local_5cf8;
  Vertex local_5cd8;
  anon_class_1_0_00000001 local_5c99;
  function<void_()> local_5c98;
  BasicEdge<wchar_t> local_5c78;
  int local_5c44;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5c40;
  Vertex local_5c08;
  anon_class_1_0_00000001 local_5bc9;
  function<void_()> local_5bc8;
  Vertex local_5ba8;
  anon_class_1_0_00000001 local_5b69;
  function<void_()> local_5b68;
  Vertex local_5b48;
  anon_class_1_0_00000001 local_5b09;
  function<void_()> local_5b08;
  Vertex local_5ae8;
  BasicEdge<wchar_t> local_5ab0;
  int local_5a7c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5a78;
  int local_5a3c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5a38;
  anon_class_1_0_00000001 local_59f9;
  function<void_()> local_59f8;
  Vertex local_59d8;
  anon_class_1_0_00000001 local_5999;
  function<void_()> local_5998;
  Vertex local_5978;
  anon_class_1_0_00000001 local_5939;
  function<void_()> local_5938;
  Vertex local_5918;
  anon_class_1_0_00000001 local_58d9;
  function<void_()> local_58d8;
  Vertex local_58b8;
  anon_class_1_0_00000001 local_5879;
  function<void_()> local_5878;
  int local_5854;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5850;
  Vertex local_5818;
  anon_class_1_0_00000001 local_57d9;
  function<void_()> local_57d8;
  int local_57b4;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_57b0;
  Vertex local_5778;
  int local_573c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5738;
  BasicEdge<wchar_t> local_5700;
  int local_56cc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_56c8;
  anon_class_1_0_00000001 local_5689;
  function<void_()> local_5688;
  int local_5664;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5660;
  Vertex local_5628;
  int local_55ec;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_55e8;
  anon_class_1_0_00000001 local_55a9;
  function<void_()> local_55a8;
  BasicEdge<wchar_t> local_5588;
  int local_5554;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5550;
  int local_5514;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5510;
  Vertex local_54d8;
  anon_class_1_0_00000001 local_5499;
  function<void_()> local_5498;
  Vertex local_5478;
  BasicEdge<wchar_t> local_5440;
  int local_540c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5408;
  BasicEdge<wchar_t> local_53d0;
  int local_539c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5398;
  BasicEdge<wchar_t> local_5360;
  int local_532c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5328;
  anon_class_1_0_00000001 local_52e9;
  function<void_()> local_52e8;
  Vertex local_52c8;
  anon_class_1_0_00000001 local_5289;
  function<void_()> local_5288;
  Vertex local_5268;
  BasicEdge<wchar_t> local_5230;
  int local_51fc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_51f8;
  BasicEdge<wchar_t> local_51c0;
  int local_518c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5188;
  BasicEdge<wchar_t> local_5150;
  int local_511c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5118;
  BasicEdge<wchar_t> local_50e0;
  int local_50ac;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_50a8;
  BasicEdge<wchar_t> local_5070;
  int local_503c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_5038;
  BasicEdge<wchar_t> local_5000;
  int local_4fcc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4fc8;
  BasicEdge<wchar_t> local_4f90;
  int local_4f5c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4f58;
  BasicEdge<wchar_t> local_4f20;
  int local_4eec;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4ee8;
  anon_class_1_0_00000001 local_4ea9;
  function<void_()> local_4ea8;
  Vertex local_4e88;
  BasicEdge<wchar_t> local_4e50;
  int local_4e1c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4e18;
  BasicEdge<wchar_t> local_4de0;
  int local_4dac;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4da8;
  BasicEdge<wchar_t> local_4d70;
  int local_4d3c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4d38;
  BasicEdge<wchar_t> local_4d00;
  int local_4ccc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4cc8;
  BasicEdge<wchar_t> local_4c90;
  int local_4c5c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4c58;
  BasicEdge<wchar_t> local_4c20;
  int local_4bec;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4be8;
  anon_class_1_0_00000001 local_4ba9;
  function<void_()> local_4ba8;
  Vertex local_4b88;
  BasicEdge<wchar_t> local_4b50;
  int local_4b1c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4b18;
  BasicEdge<wchar_t> local_4ae0;
  int local_4aac;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4aa8;
  BasicEdge<wchar_t> local_4a70;
  int local_4a3c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4a38;
  BasicEdge<wchar_t> local_4a00;
  int local_49cc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_49c8;
  anon_class_1_0_00000001 local_4989;
  function<void_()> local_4988;
  Vertex local_4968;
  BasicEdge<wchar_t> local_4930;
  int local_48fc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_48f8;
  BasicEdge<wchar_t> local_48c0;
  int local_488c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4888;
  BasicEdge<wchar_t> local_4850;
  int local_481c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4818;
  anon_class_1_0_00000001 local_47d9;
  function<void_()> local_47d8;
  Vertex local_47b8;
  BasicEdge<wchar_t> local_4780;
  int local_474c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4748;
  BasicEdge<wchar_t> local_4710;
  int local_46dc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_46d8;
  BasicEdge<wchar_t> local_46a0;
  int local_466c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4668;
  BasicEdge<wchar_t> local_4630;
  int local_45fc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_45f8;
  anon_class_1_0_00000001 local_45b9;
  function<void_()> local_45b8;
  Vertex local_4598;
  BasicEdge<wchar_t> local_4560;
  int local_452c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4528;
  BasicEdge<wchar_t> local_44f0;
  int local_44bc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_44b8;
  BasicEdge<wchar_t> local_4480;
  int local_444c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4448;
  BasicEdge<wchar_t> local_4410;
  int local_43dc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_43d8;
  BasicEdge<wchar_t> local_43a0;
  int local_436c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4368;
  anon_class_1_0_00000001 local_4329;
  function<void_()> local_4328;
  Vertex local_4308;
  BasicEdge<wchar_t> local_42d0;
  int local_429c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4298;
  BasicEdge<wchar_t> local_4260;
  int local_422c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4228;
  anon_class_1_0_00000001 local_41e9;
  function<void_()> local_41e8;
  Vertex local_41c8;
  BasicEdge<wchar_t> local_4190;
  int local_415c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4158;
  BasicEdge<wchar_t> local_4120;
  int local_40ec;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_40e8;
  BasicEdge<wchar_t> local_40b0;
  int local_407c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4078;
  BasicEdge<wchar_t> local_4040;
  int local_400c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_4008;
  BasicEdge<wchar_t> local_3fd0;
  int local_3f9c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3f98;
  BasicEdge<wchar_t> local_3f60;
  int local_3f2c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3f28;
  BasicEdge<wchar_t> local_3ef0;
  int local_3ebc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3eb8;
  BasicEdge<wchar_t> local_3e80;
  int local_3e4c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3e48;
  BasicEdge<wchar_t> local_3e10;
  int local_3ddc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3dd8;
  anon_class_1_0_00000001 local_3d99;
  function<void_()> local_3d98;
  Vertex local_3d78;
  BasicEdge<wchar_t> local_3d40;
  int local_3d0c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3d08;
  BasicEdge<wchar_t> local_3cd0;
  int local_3c9c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3c98;
  BasicEdge<wchar_t> local_3c60;
  int local_3c2c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3c28;
  BasicEdge<wchar_t> local_3bf0;
  int local_3bbc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3bb8;
  BasicEdge<wchar_t> local_3b80;
  int local_3b4c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3b48;
  BasicEdge<wchar_t> local_3b10;
  int local_3adc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3ad8;
  BasicEdge<wchar_t> local_3aa0;
  int local_3a6c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3a68;
  anon_class_1_0_00000001 local_3a29;
  function<void_()> local_3a28;
  Vertex local_3a08;
  BasicEdge<wchar_t> local_39d0;
  int local_399c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3998;
  BasicEdge<wchar_t> local_3960;
  int local_392c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3928;
  BasicEdge<wchar_t> local_38f0;
  int local_38bc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_38b8;
  BasicEdge<wchar_t> local_3880;
  int local_384c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3848;
  anon_class_1_0_00000001 local_3809;
  function<void_()> local_3808;
  Vertex local_37e8;
  BasicEdge<wchar_t> local_37b0;
  int local_377c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3778;
  BasicEdge<wchar_t> local_3740;
  int local_370c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3708;
  BasicEdge<wchar_t> local_36d0;
  int local_369c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3698;
  BasicEdge<wchar_t> local_3660;
  int local_362c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3628;
  BasicEdge<wchar_t> local_35f0;
  int local_35bc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_35b8;
  BasicEdge<wchar_t> local_3580;
  int local_354c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3548;
  anon_class_1_0_00000001 local_3509;
  function<void_()> local_3508;
  Vertex local_34e8;
  BasicEdge<wchar_t> local_34b0;
  int local_347c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3478;
  BasicEdge<wchar_t> local_3440;
  int local_340c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3408;
  BasicEdge<wchar_t> local_33d0;
  int local_339c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3398;
  BasicEdge<wchar_t> local_3360;
  int local_332c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3328;
  BasicEdge<wchar_t> local_32f0;
  int local_32bc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_32b8;
  BasicEdge<wchar_t> local_3280;
  int local_324c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3248;
  anon_class_1_0_00000001 local_3209;
  function<void_()> local_3208;
  Vertex local_31e8;
  BasicEdge<wchar_t> local_31b0;
  int local_317c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3178;
  BasicEdge<wchar_t> local_3140;
  int local_310c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3108;
  BasicEdge<wchar_t> local_30d0;
  int local_309c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3098;
  BasicEdge<wchar_t> local_3060;
  int local_302c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_3028;
  anon_class_1_0_00000001 local_2fe9;
  function<void_()> local_2fe8;
  Vertex local_2fc8;
  BasicEdge<wchar_t> local_2f90;
  int local_2f5c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2f58;
  BasicEdge<wchar_t> local_2f20;
  int local_2eec;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2ee8;
  BasicEdge<wchar_t> local_2eb0;
  int local_2e7c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2e78;
  BasicEdge<wchar_t> local_2e40;
  int local_2e0c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2e08;
  BasicEdge<wchar_t> local_2dd0;
  int local_2d9c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2d98;
  BasicEdge<wchar_t> local_2d60;
  int local_2d2c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2d28;
  BasicEdge<wchar_t> local_2cf0;
  int local_2cbc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2cb8;
  anon_class_1_0_00000001 local_2c79;
  function<void_()> local_2c78;
  Vertex local_2c58;
  BasicEdge<wchar_t> local_2c20;
  int local_2bec;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2be8;
  BasicEdge<wchar_t> local_2bb0;
  int local_2b7c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2b78;
  BasicEdge<wchar_t> local_2b40;
  int local_2b0c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2b08;
  BasicEdge<wchar_t> local_2ad0;
  int local_2a9c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2a98;
  BasicEdge<wchar_t> local_2a60;
  int local_2a2c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2a28;
  BasicEdge<wchar_t> local_29f0;
  int local_29bc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_29b8;
  BasicEdge<wchar_t> local_2980;
  int local_294c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2948;
  BasicEdge<wchar_t> local_2910;
  int local_28dc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_28d8;
  BasicEdge<wchar_t> local_28a0;
  int local_286c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2868;
  BasicEdge<wchar_t> local_2830;
  int local_27fc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_27f8;
  BasicEdge<wchar_t> local_27c0;
  int local_278c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2788;
  BasicEdge<wchar_t> local_2750;
  int local_271c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2718;
  BasicEdge<wchar_t> local_26e0;
  int local_26ac;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_26a8;
  BasicEdge<wchar_t> local_2670;
  int local_263c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2638;
  BasicEdge<wchar_t> local_2600;
  int local_25cc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_25c8;
  BasicEdge<wchar_t> local_2590;
  int local_255c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2558;
  BasicEdge<wchar_t> local_2520;
  int local_24ec;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_24e8;
  BasicEdge<wchar_t> local_24b0;
  int local_247c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2478;
  BasicEdge<wchar_t> local_2440;
  int local_240c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2408;
  BasicEdge<wchar_t> local_23d0;
  int local_239c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2398;
  int local_235c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2358;
  BasicEdge<wchar_t> local_2320;
  int local_22ec;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_22e8;
  int local_22ac;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_22a8;
  BasicEdge<wchar_t> local_2270;
  int local_223c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2238;
  BasicEdge<wchar_t> local_2200;
  int local_21cc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_21c8;
  BasicEdge<wchar_t> local_2190;
  int local_215c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2158;
  BasicEdge<wchar_t> local_2120;
  int local_20ec;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_20e8;
  BasicEdge<wchar_t> local_20b0;
  int local_207c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2078;
  BasicEdge<wchar_t> local_2040;
  int local_200c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_2008;
  BasicEdge<wchar_t> local_1fd0;
  int local_1f9c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_1f98;
  BasicEdge<wchar_t> local_1f60;
  int local_1f2c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_1f28;
  BasicEdge<wchar_t> local_1ef0;
  int local_1ebc;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_1eb8;
  BasicEdge<wchar_t> local_1e80;
  int local_1e4c;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> local_1e48;
  Vertex *local_1e10;
  Vertex local_1e08;
  Vertex local_1dd0;
  Vertex local_1d98;
  Vertex local_1d60;
  Vertex local_1d28;
  Vertex local_1cf0;
  Vertex local_1cb8;
  Vertex local_1c80;
  Vertex local_1c48;
  Vertex local_1c10;
  Vertex local_1bd8;
  Vertex local_1ba0;
  Vertex local_1b68;
  Vertex local_1b30;
  Vertex local_1af8;
  Vertex local_1ac0;
  Vertex local_1a88;
  Vertex local_1a50;
  Vertex local_1a18;
  Vertex local_19e0;
  Vertex local_19a8;
  Vertex local_1970;
  Vertex local_1938;
  Vertex local_1900;
  Vertex local_18c8;
  Vertex local_1890;
  Vertex local_1858;
  Vertex local_1820;
  Vertex local_17e8;
  Vertex local_17b0;
  Vertex local_1778;
  Vertex local_1740;
  Vertex local_1708;
  Vertex local_16d0;
  Vertex local_1698;
  Vertex local_1660;
  Vertex local_1628;
  Vertex local_15f0;
  Vertex local_15b8;
  Vertex local_1580;
  Vertex local_1548;
  Vertex local_1510;
  Vertex local_14d8;
  Vertex local_14a0;
  Vertex local_1468;
  Vertex local_1430;
  Vertex local_13f8;
  Vertex local_13c0;
  Vertex local_1388;
  Vertex local_1350;
  Vertex local_1318;
  Vertex local_12e0;
  Vertex local_12a8;
  Vertex local_1270;
  Vertex local_1238;
  Vertex local_1200;
  Vertex local_11c8;
  Vertex local_1190;
  Vertex local_1158;
  Vertex local_1120;
  Vertex local_10e8;
  Vertex local_10b0;
  Vertex local_1078;
  Vertex local_1040;
  Vertex local_1008;
  Vertex local_fd0;
  Vertex local_f98;
  Vertex local_f60;
  Vertex local_f28;
  Vertex local_ef0;
  Vertex local_eb8;
  Vertex local_e80;
  Vertex local_e48;
  Vertex local_e10;
  Vertex local_dd8;
  Vertex local_da0;
  Vertex local_d68;
  Vertex local_d30;
  Vertex local_cf8;
  Vertex local_cc0;
  Vertex local_c88;
  Vertex local_c50;
  Vertex local_c18;
  Vertex local_be0;
  Vertex local_ba8;
  Vertex local_b70;
  Vertex local_b38;
  Vertex local_b00;
  Vertex local_ac8;
  Vertex local_a90;
  Vertex local_a58;
  Vertex local_a20;
  Vertex local_9e8;
  Vertex local_9b0;
  Vertex local_978;
  Vertex local_940;
  Vertex local_908;
  Vertex local_8d0;
  Vertex local_898;
  Vertex local_860;
  Vertex local_828;
  Vertex local_7f0;
  Vertex local_7b8;
  Vertex local_780;
  Vertex local_748;
  Vertex local_710;
  Vertex local_6d8;
  Vertex local_6a0;
  Vertex local_668;
  Vertex local_630;
  Vertex local_5f8;
  Vertex local_5c0;
  Vertex local_588;
  Vertex local_550;
  Vertex local_518;
  Vertex local_4e0;
  Vertex local_4a8;
  Vertex local_470;
  Vertex local_438;
  Vertex local_400;
  undefined1 local_3c8 [64];
  BasicEdge<wchar_t> local_388;
  undefined1 local_358 [8];
  Edge alphaSpaceEdge;
  BasicEdge<wchar_t> local_2f8;
  BasicEdge<wchar_t> local_2c8;
  undefined1 local_298 [8];
  Edge alphaDigitSpaceEdge;
  undefined1 local_238 [8];
  Edge hexDigitEdge;
  BasicEdge<wchar_t> local_1d8;
  BasicEdge<wchar_t> local_1a8;
  BasicEdge<wchar_t> local_178;
  BasicEdge<wchar_t> local_148;
  undefined1 local_118 [8];
  Edge printableEdge;
  Edge miscEdge;
  Edge spaceEdge;
  Edge alphaEdge;
  undefined1 local_48 [8];
  Edge digitEdge;
  Fst *result;
  
  digitEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  Transducer::BasicFst<wchar_t>::BasicFst(in_RDI);
  Transducer::BasicEdge<wchar_t>::
  create<wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t>
            ((BasicEdge<wchar_t> *)local_48,(BasicEdge<wchar_t> *)0x30,L'1',L'2',L'3',L'4',L'5',L'6'
             ,L'7',L'8',L'9',in_stack_ffffffffffff9540);
  rest_24 = 'I';
  Transducer::BasicEdge<wchar_t>::
  create<wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t>
            (&spaceEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (BasicEdge<wchar_t> *)0x430,0x431,0x432,0x433,0x434);
  Transducer::BasicEdge<wchar_t>::create<wchar_t>
            ((BasicEdge<wchar_t> *)&miscEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             L' ',L'_');
  rest_10 = L'+';
  Transducer::BasicEdge<wchar_t>::
  create<wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,char>
            ((BasicEdge<wchar_t> *)
             &printableEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (BasicEdge<wchar_t> *)0x7e,L'`',L'!',L'#',L'$',L'%',L'^',L'&',L'*',L'(',L')',L'-',L'+',
             L'=',L'/',L'\\',L'|',L'}',L'{',L'[',L']',L'.',L',',L'?',L'№',L';',rest_24);
  Transducer::BasicEdge<wchar_t>::BasicEdge
            (&local_1a8,
             (BasicEdge<wchar_t> *)&spaceEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count
            );
  Transducer::BasicEdge<wchar_t>::operator+(&local_178,(BasicEdge<wchar_t> *)local_48,&local_1a8);
  Transducer::BasicEdge<wchar_t>::BasicEdge
            (&local_1d8,
             (BasicEdge<wchar_t> *)&miscEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  Transducer::BasicEdge<wchar_t>::operator+(&local_148,&local_178,&local_1d8);
  Transducer::BasicEdge<wchar_t>::BasicEdge
            ((BasicEdge<wchar_t> *)
             &hexDigitEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (BasicEdge<wchar_t> *)
             &printableEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Transducer::BasicEdge<wchar_t>::operator+
            ((BasicEdge<wchar_t> *)local_118,&local_148,
             (BasicEdge<wchar_t> *)
             &hexDigitEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Transducer::BasicEdge<wchar_t>::~BasicEdge
            ((BasicEdge<wchar_t> *)
             &hexDigitEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_148);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_1d8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_178);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_1a8);
  Transducer::BasicEdge<wchar_t>::
  create<wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t,wchar_t>
            ((BasicEdge<wchar_t> *)
             &alphaDigitSpaceEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (BasicEdge<wchar_t> *)0x41,L'B',L'C',L'D',L'E',L'F',L'a',L'b',L'c',L'd',L'e',L'f',
             rest_10);
  Transducer::BasicEdge<wchar_t>::operator+
            ((BasicEdge<wchar_t> *)local_238,(BasicEdge<wchar_t> *)local_48,
             (BasicEdge<wchar_t> *)
             &alphaDigitSpaceEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Transducer::BasicEdge<wchar_t>::~BasicEdge
            ((BasicEdge<wchar_t> *)
             &alphaDigitSpaceEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Transducer::BasicEdge<wchar_t>::BasicEdge
            (&local_2f8,
             (BasicEdge<wchar_t> *)&spaceEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count
            );
  Transducer::BasicEdge<wchar_t>::operator+(&local_2c8,(BasicEdge<wchar_t> *)local_48,&local_2f8);
  Transducer::BasicEdge<wchar_t>::create
            ((BasicEdge<wchar_t> *)
             &alphaSpaceEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count,L'_');
  Transducer::BasicEdge<wchar_t>::operator+
            ((BasicEdge<wchar_t> *)local_298,&local_2c8,
             (BasicEdge<wchar_t> *)
             &alphaSpaceEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Transducer::BasicEdge<wchar_t>::~BasicEdge
            ((BasicEdge<wchar_t> *)
             &alphaSpaceEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2c8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2f8);
  Transducer::BasicEdge<wchar_t>::create(&local_388,L'_');
  Transducer::BasicEdge<wchar_t>::operator+
            ((BasicEdge<wchar_t> *)local_358,
             (BasicEdge<wchar_t> *)&spaceEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count
             ,&local_388);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_388);
  local_1e10 = &local_1e08;
  local_1e4c = 1;
  Transducer::BasicEdge<wchar_t>::create(&local_1e80,L'@');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_1e48,&local_1e4c,&local_1e80);
  local_1ebc = 0xf;
  Transducer::BasicEdge<wchar_t>::create(&local_1ef0,L'б');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_1eb8,&local_1ebc,&local_1ef0);
  local_1f2c = 0x14;
  Transducer::BasicEdge<wchar_t>::create(&local_1f60,L'в');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_1f28,&local_1f2c,&local_1f60);
  local_1f9c = 0x1b;
  Transducer::BasicEdge<wchar_t>::create(&local_1fd0,L'д');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_1f98,&local_1f9c,&local_1fd0);
  local_200c = 0x22;
  Transducer::BasicEdge<wchar_t>::create(&local_2040,L'к');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2008,&local_200c,&local_2040);
  local_207c = 0x27;
  Transducer::BasicEdge<wchar_t>::create(&local_20b0,L'л');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2078,&local_207c,&local_20b0);
  local_20ec = 0x2f;
  Transducer::BasicEdge<wchar_t>::create(&local_2120,L'п');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_20e8,&local_20ec,&local_2120);
  local_215c = 0x47;
  Transducer::BasicEdge<wchar_t>::create(&local_2190,L'р');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2158,&local_215c,&local_2190);
  local_21cc = 0x4c;
  Transducer::BasicEdge<wchar_t>::create(&local_2200,L'с');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_21c8,&local_21cc,&local_2200);
  local_223c = 0x52;
  Transducer::BasicEdge<wchar_t>::create(&local_2270,L'ц');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2238,&local_223c,&local_2270);
  local_22ac = 0x5f;
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>&>
            (&local_22a8,&local_22ac,(BasicEdge<wchar_t> *)local_48);
  local_22ec = 0x62;
  Transducer::BasicEdge<wchar_t>::create(&local_2320,L'0');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_22e8,&local_22ec,&local_2320);
  local_235c = 0x65;
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>&>
            (&local_2358,&local_235c,(BasicEdge<wchar_t> *)local_358);
  local_239c = 0x66;
  Transducer::BasicEdge<wchar_t>::create(&local_23d0,L'+');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2398,&local_239c,&local_23d0);
  local_240c = 0x67;
  Transducer::BasicEdge<wchar_t>::create(&local_2440,L'-');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2408,&local_240c,&local_2440);
  local_247c = 0x68;
  Transducer::BasicEdge<wchar_t>::create(&local_24b0,L'*');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2478,&local_247c,&local_24b0);
  local_24ec = 0x69;
  Transducer::BasicEdge<wchar_t>::create(&local_2520,L'/');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_24e8,&local_24ec,&local_2520);
  local_255c = 0x6a;
  Transducer::BasicEdge<wchar_t>::create(&local_2590,L'\"');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2558,&local_255c,&local_2590);
  local_25cc = 0x6c;
  Transducer::BasicEdge<wchar_t>::create(&local_2600,L';');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_25c8,&local_25cc,&local_2600);
  local_263c = 0x6d;
  Transducer::BasicEdge<wchar_t>::create(&local_2670,L':');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2638,&local_263c,&local_2670);
  local_26ac = 0x6e;
  Transducer::BasicEdge<wchar_t>::create(&local_26e0,L'=');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_26a8,&local_26ac,&local_26e0);
  local_271c = 0x70;
  Transducer::BasicEdge<wchar_t>::create(&local_2750,L'(');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2718,&local_271c,&local_2750);
  local_278c = 0x71;
  Transducer::BasicEdge<wchar_t>::create(&local_27c0,L')');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2788,&local_278c,&local_27c0);
  local_27fc = 0x72;
  Transducer::BasicEdge<wchar_t>::create(&local_2830,L'<');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_27f8,&local_27fc,&local_2830);
  local_286c = 0x74;
  Transducer::BasicEdge<wchar_t>::create(&local_28a0,L'>');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2868,&local_286c,&local_28a0);
  local_28dc = 0x76;
  Transducer::BasicEdge<wchar_t>::create(&local_2910,L',');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_28d8,&local_28dc,&local_2910);
  local_294c = 0x77;
  Transducer::BasicEdge<wchar_t>::create(&local_2980,L'%');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2948,&local_294c,&local_2980);
  Transducer::BasicFst<wchar_t>::Vertex::
  Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1e08,&local_1e48,&local_1eb8,&local_1f28,&local_1f98,&local_2008,&local_2078,
             &local_20e8,&local_2158,&local_21c8,&local_2238,&local_22a8,&local_22e8,&local_2358,
             &local_2398,&local_2408,&local_2478,&local_24e8,&local_2558,&local_25c8,&local_2638,
             &local_26a8,&local_2718,&local_2788,&local_27f8,&local_2868,&local_28d8,&local_2948);
  local_29bc = 2;
  local_1e10 = &local_1dd0;
  Transducer::BasicEdge<wchar_t>::create(&local_29f0,L'н');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_29b8,&local_29bc,&local_29f0);
  local_2a2c = 7;
  Transducer::BasicEdge<wchar_t>::create(&local_2a60,L'у');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2a28,&local_2a2c,&local_2a60);
  Transducer::BasicFst<wchar_t>::Vertex::
  Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1dd0,&local_29b8,&local_2a28);
  local_2a9c = 3;
  local_1e10 = &local_1d98;
  Transducer::BasicEdge<wchar_t>::create(&local_2ad0,L'у');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2a98,&local_2a9c,&local_2ad0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1d98,&local_2a98);
  local_2b0c = 4;
  local_1e10 = &local_1d60;
  Transducer::BasicEdge<wchar_t>::create(&local_2b40,L'м');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2b08,&local_2b0c,&local_2b40);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1d60,&local_2b08);
  local_2b7c = 5;
  local_1e10 = &local_1d28;
  Transducer::BasicEdge<wchar_t>::create(&local_2bb0,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2b78,&local_2b7c,&local_2bb0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1d28,&local_2b78);
  local_2bec = 6;
  local_1e10 = &local_1cf0;
  Transducer::BasicEdge<wchar_t>::create(&local_2c20,L'р');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2be8,&local_2bec,&local_2c20);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1cf0,&local_2be8);
  local_1e10 = &local_1cb8;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_2c58);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__0,void>
            ((function<void()> *)&local_2c78,&local_2c79);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_2c58,&local_2c78);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_1cb8,pVVar1);
  local_2cbc = 8;
  local_1e10 = &local_1c80;
  Transducer::BasicEdge<wchar_t>::create(&local_2cf0,L'к');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2cb8,&local_2cbc,&local_2cf0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1c80,&local_2cb8);
  local_2d2c = 9;
  local_1e10 = &local_1c48;
  Transducer::BasicEdge<wchar_t>::create(&local_2d60,L'л');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2d28,&local_2d2c,&local_2d60);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1c48,&local_2d28);
  local_2d9c = 10;
  local_1e10 = &local_1c10;
  Transducer::BasicEdge<wchar_t>::create(&local_2dd0,L'ю');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2d98,&local_2d9c,&local_2dd0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1c10,&local_2d98);
  local_2e0c = 0xb;
  local_1e10 = &local_1bd8;
  Transducer::BasicEdge<wchar_t>::create(&local_2e40,L'ч');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2e08,&local_2e0c,&local_2e40);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1bd8,&local_2e08);
  local_2e7c = 0xc;
  local_1e10 = &local_1ba0;
  Transducer::BasicEdge<wchar_t>::create(&local_2eb0,L'ы');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2e78,&local_2e7c,&local_2eb0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1ba0,&local_2e78);
  local_2eec = 0xd;
  local_1e10 = &local_1b68;
  Transducer::BasicEdge<wchar_t>::create(&local_2f20,L'ц');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2ee8,&local_2eec,&local_2f20);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1b68,&local_2ee8);
  local_2f5c = 0xe;
  local_1e10 = &local_1b30;
  Transducer::BasicEdge<wchar_t>::create(&local_2f90,L'ь');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_2f58,&local_2f5c,&local_2f90);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1b30,&local_2f58);
  local_1e10 = &local_1af8;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_2fc8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__1,void>
            ((function<void()> *)&local_2fe8,&local_2fe9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_2fc8,&local_2fe8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_1af8,pVVar1);
  local_302c = 0x10;
  local_1e10 = &local_1ac0;
  Transducer::BasicEdge<wchar_t>::create(&local_3060,L'у');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3028,&local_302c,&local_3060);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1ac0,&local_3028);
  local_309c = 0x11;
  local_1e10 = &local_1a88;
  Transducer::BasicEdge<wchar_t>::create(&local_30d0,L'д');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3098,&local_309c,&local_30d0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1a88,&local_3098);
  local_310c = 0x12;
  local_1e10 = &local_1a50;
  Transducer::BasicEdge<wchar_t>::create(&local_3140,L'з');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3108,&local_310c,&local_3140);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1a50,&local_3108);
  local_317c = 0x13;
  local_1e10 = &local_1a18;
  Transducer::BasicEdge<wchar_t>::create(&local_31b0,L'е');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3178,&local_317c,&local_31b0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1a18,&local_3178);
  local_1e10 = &local_19e0;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_31e8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__2,void>
            ((function<void()> *)&local_3208,&local_3209);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_31e8,&local_3208);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_19e0,pVVar1);
  local_324c = 0x15;
  local_1e10 = &local_19a8;
  Transducer::BasicEdge<wchar_t>::create(&local_3280,L'я');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3248,&local_324c,&local_3280);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_19a8,&local_3248);
  local_32bc = 0x16;
  local_1e10 = &local_1970;
  Transducer::BasicEdge<wchar_t>::create(&local_32f0,L'р');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_32b8,&local_32bc,&local_32f0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1970,&local_32b8);
  local_332c = 0x17;
  local_1e10 = &local_1938;
  Transducer::BasicEdge<wchar_t>::create(&local_3360,L'н');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3328,&local_332c,&local_3360);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1938,&local_3328);
  local_339c = 0x18;
  local_1e10 = &local_1900;
  Transducer::BasicEdge<wchar_t>::create(&local_33d0,L'у');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3398,&local_339c,&local_33d0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1900,&local_3398);
  local_340c = 0x19;
  local_1e10 = &local_18c8;
  Transducer::BasicEdge<wchar_t>::create(&local_3440,L'ц');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3408,&local_340c,&local_3440);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_18c8,&local_3408);
  local_347c = 0x1a;
  local_1e10 = &local_1890;
  Transducer::BasicEdge<wchar_t>::create(&local_34b0,L'ь');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3478,&local_347c,&local_34b0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1890,&local_3478);
  local_1e10 = &local_1858;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_34e8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__3,void>
            ((function<void()> *)&local_3508,&local_3509);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_34e8,&local_3508);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_1858,pVVar1);
  local_354c = 0x1c;
  local_1e10 = &local_1820;
  Transducer::BasicEdge<wchar_t>::create(&local_3580,L'р');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3548,&local_354c,&local_3580);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1820,&local_3548);
  local_35bc = 0x1d;
  local_1e10 = &local_17e8;
  Transducer::BasicEdge<wchar_t>::create(&local_35f0,L'о');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_35b8,&local_35bc,&local_35f0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_17e8,&local_35b8);
  local_362c = 0x1e;
  local_1e10 = &local_17b0;
  Transducer::BasicEdge<wchar_t>::create(&local_3660,L'б');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3628,&local_362c,&local_3660);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_17b0,&local_3628);
  local_369c = 0x1f;
  local_1e10 = &local_1778;
  Transducer::BasicEdge<wchar_t>::create(&local_36d0,L'н');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3698,&local_369c,&local_36d0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1778,&local_3698);
  local_370c = 0x20;
  local_1e10 = &local_1740;
  Transducer::BasicEdge<wchar_t>::create(&local_3740,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3708,&local_370c,&local_3740);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1740,&local_3708);
  local_377c = 0x21;
  local_1e10 = &local_1708;
  Transducer::BasicEdge<wchar_t>::create(&local_37b0,L'е');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3778,&local_377c,&local_37b0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1708,&local_3778);
  local_1e10 = &local_16d0;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_37e8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__4,void>
            ((function<void()> *)&local_3808,&local_3809);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_37e8,&local_3808);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_16d0,pVVar1);
  local_384c = 0x23;
  local_1e10 = &local_1698;
  Transducer::BasicEdge<wchar_t>::create(&local_3880,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3848,&local_384c,&local_3880);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1698,&local_3848);
  local_38bc = 0x24;
  local_1e10 = &local_1660;
  Transducer::BasicEdge<wchar_t>::create(&local_38f0,L'н');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_38b8,&local_38bc,&local_38f0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1660,&local_38b8);
  local_392c = 0x25;
  local_1e10 = &local_1628;
  Transducer::BasicEdge<wchar_t>::create(&local_3960,L'е');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3928,&local_392c,&local_3960);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1628,&local_3928);
  local_399c = 0x26;
  local_1e10 = &local_15f0;
  Transducer::BasicEdge<wchar_t>::create(&local_39d0,L'ц');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3998,&local_399c,&local_39d0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_15f0,&local_3998);
  local_1e10 = &local_15b8;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_3a08);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__5,void>
            ((function<void()> *)&local_3a28,&local_3a29);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_3a08,&local_3a28);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_15b8,pVVar1);
  local_3a6c = 0x28;
  local_1e10 = &local_1580;
  Transducer::BasicEdge<wchar_t>::create(&local_3aa0,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3a68,&local_3a6c,&local_3aa0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1580,&local_3a68);
  local_3adc = 0x29;
  local_1e10 = &local_1548;
  Transducer::BasicEdge<wchar_t>::create(&local_3b10,L'г');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3ad8,&local_3adc,&local_3b10);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1548,&local_3ad8);
  local_3b4c = 0x2a;
  local_1e10 = &local_1510;
  Transducer::BasicEdge<wchar_t>::create(&local_3b80,L'i');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3b48,&local_3b4c,&local_3b80);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1510,&local_3b48);
  local_3bbc = 0x2b;
  local_1e10 = &local_14d8;
  Transducer::BasicEdge<wchar_t>::create(&local_3bf0,L'ч');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3bb8,&local_3bbc,&local_3bf0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_14d8,&local_3bb8);
  local_3c2c = 0x2c;
  local_1e10 = &local_14a0;
  Transducer::BasicEdge<wchar_t>::create(&local_3c60,L'н');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3c28,&local_3c2c,&local_3c60);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_14a0,&local_3c28);
  local_3c9c = 0x2d;
  local_1e10 = &local_1468;
  Transducer::BasicEdge<wchar_t>::create(&local_3cd0,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3c98,&local_3c9c,&local_3cd0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1468,&local_3c98);
  local_3d0c = 0x2e;
  local_1e10 = &local_1430;
  Transducer::BasicEdge<wchar_t>::create(&local_3d40,L'е');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3d08,&local_3d0c,&local_3d40);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1430,&local_3d08);
  local_1e10 = &local_13f8;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_3d78);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__6,void>
            ((function<void()> *)&local_3d98,&local_3d99);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_3d78,&local_3d98);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_13f8,pVVar1);
  local_3ddc = 0x30;
  local_1e10 = &local_13c0;
  Transducer::BasicEdge<wchar_t>::create(&local_3e10,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3dd8,&local_3ddc,&local_3e10);
  local_3e4c = 0x43;
  Transducer::BasicEdge<wchar_t>::create(&local_3e80,L'у');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3e48,&local_3e4c,&local_3e80);
  Transducer::BasicFst<wchar_t>::Vertex::
  Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_13c0,&local_3dd8,&local_3e48);
  local_3ebc = 0x31;
  local_1e10 = &local_1388;
  Transducer::BasicEdge<wchar_t>::create(&local_3ef0,L'к');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3eb8,&local_3ebc,&local_3ef0);
  local_3f2c = 0x38;
  Transducer::BasicEdge<wchar_t>::create(&local_3f60,L'л');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3f28,&local_3f2c,&local_3f60);
  local_3f9c = 0x3e;
  Transducer::BasicEdge<wchar_t>::create(&local_3fd0,L'ч');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_3f98,&local_3f9c,&local_3fd0);
  Transducer::BasicFst<wchar_t>::Vertex::
  Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1388,&local_3eb8,&local_3f28,&local_3f98);
  local_400c = 0x32;
  local_1e10 = &local_1350;
  Transducer::BasicEdge<wchar_t>::create(&local_4040,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4008,&local_400c,&local_4040);
  local_407c = 0x35;
  Transducer::BasicEdge<wchar_t>::create(&local_40b0,L'у');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4078,&local_407c,&local_40b0);
  Transducer::BasicFst<wchar_t>::Vertex::
  Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1350,&local_4008,&local_4078);
  local_40ec = 0x33;
  local_1e10 = &local_1318;
  Transducer::BasicEdge<wchar_t>::create(&local_4120,L'ж');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_40e8,&local_40ec,&local_4120);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1318,&local_40e8);
  local_415c = 0x34;
  local_1e10 = &local_12e0;
  Transducer::BasicEdge<wchar_t>::create(&local_4190,L'ы');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4158,&local_415c,&local_4190);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_12e0,&local_4158);
  local_1e10 = &local_12a8;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_41c8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__7,void>
            ((function<void()> *)&local_41e8,&local_41e9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_41c8,&local_41e8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_12a8,pVVar1);
  local_422c = 0x36;
  local_1e10 = &local_1270;
  Transducer::BasicEdge<wchar_t>::create(&local_4260,L'л');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4228,&local_422c,&local_4260);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1270,&local_4228);
  local_429c = 0x37;
  local_1e10 = &local_1238;
  Transducer::BasicEdge<wchar_t>::create(&local_42d0,L'ь');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4298,&local_429c,&local_42d0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1238,&local_4298);
  local_1e10 = &local_1200;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_4308);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__8,void>
            ((function<void()> *)&local_4328,&local_4329);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_4308,&local_4328);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_1200,pVVar1);
  local_436c = 0x39;
  local_1e10 = &local_11c8;
  Transducer::BasicEdge<wchar_t>::create(&local_43a0,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4368,&local_436c,&local_43a0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_11c8,&local_4368);
  local_43dc = 0x3a;
  local_1e10 = &local_1190;
  Transducer::BasicEdge<wchar_t>::create(&local_4410,L'м');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_43d8,&local_43dc,&local_4410);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1190,&local_43d8);
  local_444c = 0x3b;
  local_1e10 = &local_1158;
  Transducer::BasicEdge<wchar_t>::create(&local_4480,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4448,&local_444c,&local_4480);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1158,&local_4448);
  local_44bc = 0x3c;
  local_1e10 = &local_1120;
  Transducer::BasicEdge<wchar_t>::create(&local_44f0,L'ц');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_44b8,&local_44bc,&local_44f0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1120,&local_44b8);
  local_452c = 0x3d;
  local_1e10 = &local_10e8;
  Transducer::BasicEdge<wchar_t>::create(&local_4560,L'ь');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4528,&local_452c,&local_4560);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_10e8,&local_4528);
  local_1e10 = &local_10b0;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_4598);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__9,void>
            ((function<void()> *)&local_45b8,&local_45b9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_4598,&local_45b8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_10b0,pVVar1);
  local_45fc = 0x3f;
  local_1e10 = &local_1078;
  Transducer::BasicEdge<wchar_t>::create(&local_4630,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_45f8,&local_45fc,&local_4630);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1078,&local_45f8);
  local_466c = 0x40;
  local_1e10 = &local_1040;
  Transducer::BasicEdge<wchar_t>::create(&local_46a0,L'т');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4668,&local_466c,&local_46a0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1040,&local_4668);
  local_46dc = 0x41;
  local_1e10 = &local_1008;
  Transducer::BasicEdge<wchar_t>::create(&local_4710,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_46d8,&local_46dc,&local_4710);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_1008,&local_46d8);
  local_474c = 0x42;
  local_1e10 = &local_fd0;
  Transducer::BasicEdge<wchar_t>::create(&local_4780,L'к');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4748,&local_474c,&local_4780);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_fd0,&local_4748);
  local_1e10 = &local_f98;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_47b8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__10,void>
            ((function<void()> *)&local_47d8,&local_47d9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_47b8,&local_47d8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_f98,pVVar1);
  local_481c = 0x44;
  local_1e10 = &local_f60;
  Transducer::BasicEdge<wchar_t>::create(&local_4850,L'с');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4818,&local_481c,&local_4850);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_f60,&local_4818);
  local_488c = 0x45;
  local_1e10 = &local_f28;
  Transducer::BasicEdge<wchar_t>::create(&local_48c0,L'т');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4888,&local_488c,&local_48c0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_f28,&local_4888);
  local_48fc = 0x46;
  local_1e10 = &local_ef0;
  Transducer::BasicEdge<wchar_t>::create(&local_4930,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_48f8,&local_48fc,&local_4930);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_ef0,&local_48f8);
  local_1e10 = &local_eb8;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_4968);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__11,void>
            ((function<void()> *)&local_4988,&local_4989);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_4968,&local_4988);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_eb8,pVVar1);
  local_49cc = 0x48;
  local_1e10 = &local_e80;
  Transducer::BasicEdge<wchar_t>::create(&local_4a00,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_49c8,&local_49cc,&local_4a00);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_e80,&local_49c8);
  local_4a3c = 0x49;
  local_1e10 = &local_e48;
  Transducer::BasicEdge<wchar_t>::create(&local_4a70,L'д');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4a38,&local_4a3c,&local_4a70);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_e48,&local_4a38);
  local_4aac = 0x4a;
  local_1e10 = &local_e10;
  Transducer::BasicEdge<wchar_t>::create(&local_4ae0,L'о');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4aa8,&local_4aac,&local_4ae0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_e10,&local_4aa8);
  local_4b1c = 0x4b;
  local_1e10 = &local_dd8;
  Transducer::BasicEdge<wchar_t>::create(&local_4b50,L'к');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4b18,&local_4b1c,&local_4b50);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_dd8,&local_4b18);
  local_1e10 = &local_da0;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_4b88);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__12,void>
            ((function<void()> *)&local_4ba8,&local_4ba9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_4b88,&local_4ba8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_da0,pVVar1);
  local_4bec = 0x4d;
  local_1e10 = &local_d68;
  Transducer::BasicEdge<wchar_t>::create(&local_4c20,L'п');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4be8,&local_4bec,&local_4c20);
  local_4c5c = 0x53;
  Transducer::BasicEdge<wchar_t>::create(&local_4c90,L'т');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4c58,&local_4c5c,&local_4c90);
  Transducer::BasicFst<wchar_t>::Vertex::
  Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_d68,&local_4be8,&local_4c58);
  local_4ccc = 0x4e;
  local_1e10 = &local_d30;
  Transducer::BasicEdge<wchar_t>::create(&local_4d00,L'ы');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4cc8,&local_4ccc,&local_4d00);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_d30,&local_4cc8);
  local_4d3c = 0x4f;
  local_1e10 = &local_cf8;
  Transducer::BasicEdge<wchar_t>::create(&local_4d70,L'т');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4d38,&local_4d3c,&local_4d70);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_cf8,&local_4d38);
  local_4dac = 0x50;
  local_1e10 = &local_cc0;
  Transducer::BasicEdge<wchar_t>::create(&local_4de0,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4da8,&local_4dac,&local_4de0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_cc0,&local_4da8);
  local_4e1c = 0x51;
  local_1e10 = &local_c88;
  Transducer::BasicEdge<wchar_t>::create(&local_4e50,L'й');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4e18,&local_4e1c,&local_4e50);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_c88,&local_4e18);
  local_1e10 = &local_c50;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_4e88);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__13,void>
            ((function<void()> *)&local_4ea8,&local_4ea9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_4e88,&local_4ea8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_c50,pVVar1);
  local_4eec = 0x5a;
  local_1e10 = &local_c18;
  Transducer::BasicEdge<wchar_t>::create(&local_4f20,L'i');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4ee8,&local_4eec,&local_4f20);
  local_4f5c = 0x5b;
  Transducer::BasicEdge<wchar_t>::create(&local_4f90,L'э');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4f58,&local_4f5c,&local_4f90);
  Transducer::BasicFst<wchar_t>::Vertex::
  Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_c18,&local_4ee8,&local_4f58);
  local_4fcc = 0x54;
  local_1e10 = &local_be0;
  Transducer::BasicEdge<wchar_t>::create(&local_5000,L'в');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_4fc8,&local_4fcc,&local_5000);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_be0,&local_4fc8);
  local_503c = 0x55;
  local_1e10 = &local_ba8;
  Transducer::BasicEdge<wchar_t>::create(&local_5070,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_5038,&local_503c,&local_5070);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_ba8,&local_5038);
  local_50ac = 0x56;
  local_1e10 = &local_b70;
  Transducer::BasicEdge<wchar_t>::create(&local_50e0,L'р');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_50a8,&local_50ac,&local_50e0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_b70,&local_50a8);
  local_511c = 0x57;
  local_1e10 = &local_b38;
  Transducer::BasicEdge<wchar_t>::create(&local_5150,L'ы');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_5118,&local_511c,&local_5150);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_b38,&local_5118);
  local_518c = 0x58;
  local_1e10 = &local_b00;
  Transducer::BasicEdge<wchar_t>::create(&local_51c0,L'ц');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_5188,&local_518c,&local_51c0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_b00,&local_5188);
  local_51fc = 0x59;
  local_1e10 = &local_ac8;
  Transducer::BasicEdge<wchar_t>::create(&local_5230,L'ь');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_51f8,&local_51fc,&local_5230);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_ac8,&local_51f8);
  local_1e10 = &local_a90;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5268);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__14,void>
            ((function<void()> *)&local_5288,&local_5289);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5268,&local_5288);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_a90,pVVar1);
  local_1e10 = &local_a58;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_52c8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__15,void>
            ((function<void()> *)&local_52e8,&local_52e9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_52c8,&local_52e8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_a58,pVVar1);
  local_532c = 0x5c;
  local_1e10 = &local_a20;
  Transducer::BasicEdge<wchar_t>::create(&local_5360,L'л');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_5328,&local_532c,&local_5360);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_a20,&local_5328);
  local_539c = 0x5d;
  local_1e10 = &local_9e8;
  Transducer::BasicEdge<wchar_t>::create(&local_53d0,L'а');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_5398,&local_539c,&local_53d0);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_9e8,&local_5398);
  local_540c = 0x5e;
  local_1e10 = &local_9b0;
  Transducer::BasicEdge<wchar_t>::create(&local_5440,L'е');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_5408,&local_540c,&local_5440);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_9b0,&local_5408);
  local_1e10 = &local_978;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5478);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__16,void>
            ((function<void()> *)&local_5498,&local_5499);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5478,&local_5498);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_978,pVVar1);
  local_5514 = 0x5f;
  local_1e10 = &local_940;
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>&>
            (&local_5510,&local_5514,(BasicEdge<wchar_t> *)local_48);
  local_5554 = 0x60;
  Transducer::BasicEdge<wchar_t>::create(&local_5588,L'.');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_5550,&local_5554,&local_5588);
  Transducer::BasicFst<wchar_t>::Vertex::
  Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_54d8,&local_5510,&local_5550);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__17,void>
            ((function<void()> *)&local_55a8,&local_55a9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_54d8,&local_55a8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_940,pVVar1);
  local_55ec = 0x61;
  local_1e10 = &local_908;
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>&>
            (&local_55e8,&local_55ec,(BasicEdge<wchar_t> *)local_48);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_908,&local_55e8);
  local_5664 = 0x61;
  local_1e10 = &local_8d0;
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>&>
            (&local_5660,&local_5664,(BasicEdge<wchar_t> *)local_48);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_5628,&local_5660);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__18,void>
            ((function<void()> *)&local_5688,&local_5689);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5628,&local_5688);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_8d0,pVVar1);
  local_56cc = 99;
  local_1e10 = &local_898;
  Transducer::BasicEdge<wchar_t>::create<wchar_t>(&local_5700,L'x',L'X');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_56c8,&local_56cc,&local_5700);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_898,&local_56c8);
  local_573c = 100;
  local_1e10 = &local_860;
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>&>
            (&local_5738,&local_573c,(BasicEdge<wchar_t> *)local_238);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_860,&local_5738);
  local_57b4 = 100;
  local_1e10 = &local_828;
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>&>
            (&local_57b0,&local_57b4,(BasicEdge<wchar_t> *)local_238);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_5778,&local_57b0);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__19,void>
            ((function<void()> *)&local_57d8,&local_57d9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5778,&local_57d8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_828,pVVar1);
  local_5854 = 0x65;
  local_1e10 = &local_7f0;
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>&>
            (&local_5850,&local_5854,(BasicEdge<wchar_t> *)local_298);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_5818,&local_5850);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__20,void>
            ((function<void()> *)&local_5878,&local_5879);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5818,&local_5878);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_7f0,pVVar1);
  local_1e10 = &local_7b8;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_58b8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__21,void>
            ((function<void()> *)&local_58d8,&local_58d9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_58b8,&local_58d8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_7b8,pVVar1);
  local_1e10 = &local_780;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5918);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__22,void>
            ((function<void()> *)&local_5938,&local_5939);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5918,&local_5938);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_780,pVVar1);
  local_1e10 = &local_748;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5978);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__23,void>
            ((function<void()> *)&local_5998,&local_5999);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5978,&local_5998);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_748,pVVar1);
  local_1e10 = &local_710;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_59d8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__24,void>
            ((function<void()> *)&local_59f8,&local_59f9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_59d8,&local_59f8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_710,pVVar1);
  local_5a3c = 0x6a;
  local_1e10 = &local_6d8;
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>&>
            (&local_5a38,&local_5a3c,(BasicEdge<wchar_t> *)local_118);
  local_5a7c = 0x6b;
  Transducer::BasicEdge<wchar_t>::create(&local_5ab0,L'\"');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_5a78,&local_5a7c,&local_5ab0);
  Transducer::BasicFst<wchar_t>::Vertex::
  Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_6d8,&local_5a38,&local_5a78);
  local_1e10 = &local_6a0;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5ae8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__25,void>
            ((function<void()> *)&local_5b08,&local_5b09);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5ae8,&local_5b08);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_6a0,pVVar1);
  local_1e10 = &local_668;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5b48);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__26,void>
            ((function<void()> *)&local_5b68,&local_5b69);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5b48,&local_5b68);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_668,pVVar1);
  local_1e10 = &local_630;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5ba8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__27,void>
            ((function<void()> *)&local_5bc8,&local_5bc9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5ba8,&local_5bc8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_630,pVVar1);
  local_5c44 = 0x6f;
  local_1e10 = &local_5f8;
  Transducer::BasicEdge<wchar_t>::create(&local_5c78,L'=');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_5c40,&local_5c44,&local_5c78);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_5c08,&local_5c40);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__28,void>
            ((function<void()> *)&local_5c98,&local_5c99);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5c08,&local_5c98);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5f8,pVVar1);
  local_1e10 = &local_5c0;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5cd8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__29,void>
            ((function<void()> *)&local_5cf8,&local_5cf9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5cd8,&local_5cf8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5c0,pVVar1);
  local_1e10 = &local_588;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5d38);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__30,void>
            ((function<void()> *)&local_5d58,&local_5d59);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5d38,&local_5d58);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_588,pVVar1);
  local_1e10 = &local_550;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5d98);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__31,void>
            ((function<void()> *)&local_5db8,&local_5db9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5d98,&local_5db8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_550,pVVar1);
  local_5e34 = 0x73;
  local_1e10 = &local_518;
  Transducer::BasicEdge<wchar_t>::create(&local_5e68,L'=');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_5e30,&local_5e34,&local_5e68);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_5df8,&local_5e30);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__32,void>
            ((function<void()> *)&local_5e88,&local_5e89);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5df8,&local_5e88);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_518,pVVar1);
  local_1e10 = &local_4e0;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5ec8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__33,void>
            ((function<void()> *)&local_5ee8,&local_5ee9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5ec8,&local_5ee8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_4e0,pVVar1);
  local_5f64 = 0x75;
  local_1e10 = &local_4a8;
  Transducer::BasicEdge<wchar_t>::create(&local_5f98,L'=');
  std::make_pair<int,PDA::Transducer::BasicEdge<wchar_t>>(&local_5f60,&local_5f64,&local_5f98);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (&local_5f28,&local_5f60);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__34,void>
            ((function<void()> *)&local_5fb8,&local_5fb9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5f28,&local_5fb8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_4a8,pVVar1);
  local_1e10 = &local_470;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_5ff8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__35,void>
            ((function<void()> *)&local_6018,&local_6019);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_5ff8,&local_6018);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_470,pVVar1);
  local_1e10 = &local_438;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_6058);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__36,void>
            ((function<void()> *)&local_6078,&local_6079);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_6058,&local_6078);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_438,pVVar1);
  local_1e10 = &local_400;
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_60b8);
  std::function<void()>::function<PDA::Utils::Defaults::fst()::__37,void>
            ((function<void()> *)&local_60d8,&local_60d9);
  pVVar1 = Transducer::BasicFst<wchar_t>::Vertex::setAction(&local_60b8,&local_60d8);
  Transducer::BasicFst<wchar_t>::Vertex::Vertex(&local_400,pVVar1);
  local_3c8._0_8_ = &local_1e08;
  local_3c8._8_8_ = (_List_node_base *)0x78;
  Transducer::BasicFst<wchar_t>::BasicFst
            ((BasicFst<wchar_t> *)(local_3c8 + 0x10),
             (initializer_list<PDA::Transducer::BasicFst<wchar_t>::Vertex> *)local_3c8);
  Transducer::BasicFst<wchar_t>::operator=(in_RDI,(BasicFst<wchar_t> *)(local_3c8 + 0x10));
  Transducer::BasicFst<wchar_t>::~BasicFst((BasicFst<wchar_t> *)(local_3c8 + 0x10));
  local_6728 = (Vertex *)local_3c8;
  do {
    local_6728 = local_6728 + -1;
    Transducer::BasicFst<wchar_t>::Vertex::~Vertex(local_6728);
  } while (local_6728 != &local_1e08);
  std::function<void_()>::~function(&local_60d8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_60b8);
  std::function<void_()>::~function(&local_6078);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_6058);
  std::function<void_()>::~function(&local_6018);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5ff8);
  std::function<void_()>::~function(&local_5fb8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5f28);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5f60);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5f98);
  std::function<void_()>::~function(&local_5ee8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5ec8);
  std::function<void_()>::~function(&local_5e88);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5df8);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5e30);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5e68);
  std::function<void_()>::~function(&local_5db8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5d98);
  std::function<void_()>::~function(&local_5d58);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5d38);
  std::function<void_()>::~function(&local_5cf8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5cd8);
  std::function<void_()>::~function(&local_5c98);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5c08);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5c40);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5c78);
  std::function<void_()>::~function(&local_5bc8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5ba8);
  std::function<void_()>::~function(&local_5b68);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5b48);
  std::function<void_()>::~function(&local_5b08);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5ae8);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5a78);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5ab0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5a38);
  std::function<void_()>::~function(&local_59f8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_59d8);
  std::function<void_()>::~function(&local_5998);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5978);
  std::function<void_()>::~function(&local_5938);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5918);
  std::function<void_()>::~function(&local_58d8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_58b8);
  std::function<void_()>::~function(&local_5878);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5818);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5850);
  std::function<void_()>::~function(&local_57d8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5778);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_57b0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5738);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_56c8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5700);
  std::function<void_()>::~function(&local_5688);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5628);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5660);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_55e8);
  std::function<void_()>::~function(&local_55a8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_54d8);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5550);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5588);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5510);
  std::function<void_()>::~function(&local_5498);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5478);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5408);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5440);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5398);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_53d0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5328);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5360);
  std::function<void_()>::~function(&local_52e8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_52c8);
  std::function<void_()>::~function(&local_5288);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_5268);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_51f8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5230);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5188);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_51c0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5118);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5150);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_50a8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_50e0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_5038);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5070);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4fc8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_5000);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4f58);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4f90);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4ee8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4f20);
  std::function<void_()>::~function(&local_4ea8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_4e88);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4e18);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4e50);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4da8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4de0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4d38);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4d70);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4cc8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4d00);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4c58);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4c90);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4be8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4c20);
  std::function<void_()>::~function(&local_4ba8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_4b88);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4b18);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4b50);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4aa8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4ae0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4a38);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4a70);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_49c8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4a00);
  std::function<void_()>::~function(&local_4988);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_4968);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_48f8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4930);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4888);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_48c0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4818);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4850);
  std::function<void_()>::~function(&local_47d8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_47b8);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4748);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4780);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_46d8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4710);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4668);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_46a0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_45f8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4630);
  std::function<void_()>::~function(&local_45b8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_4598);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4528);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4560);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_44b8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_44f0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4448);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4480);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_43d8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4410);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4368);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_43a0);
  std::function<void_()>::~function(&local_4328);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_4308);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4298);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_42d0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4228);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4260);
  std::function<void_()>::~function(&local_41e8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_41c8);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4158);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4190);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_40e8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4120);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4078);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_40b0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_4008);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_4040);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3f98);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3fd0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3f28);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3f60);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3eb8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3ef0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3e48);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3e80);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3dd8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3e10);
  std::function<void_()>::~function(&local_3d98);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_3d78);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3d08);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3d40);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3c98);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3cd0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3c28);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3c60);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3bb8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3bf0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3b48);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3b80);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3ad8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3b10);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3a68);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3aa0);
  std::function<void_()>::~function(&local_3a28);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_3a08);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3998);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_39d0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3928);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3960);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_38b8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_38f0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3848);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3880);
  std::function<void_()>::~function(&local_3808);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_37e8);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3778);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_37b0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3708);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3740);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3698);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_36d0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3628);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3660);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_35b8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_35f0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3548);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3580);
  std::function<void_()>::~function(&local_3508);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_34e8);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3478);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_34b0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3408);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3440);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3398);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_33d0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3328);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3360);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_32b8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_32f0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3248);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3280);
  std::function<void_()>::~function(&local_3208);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_31e8);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3178);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_31b0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3108);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3140);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3098);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_30d0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_3028);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_3060);
  std::function<void_()>::~function(&local_2fe8);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_2fc8);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2f58);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2f90);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2ee8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2f20);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2e78);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2eb0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2e08);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2e40);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2d98);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2dd0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2d28);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2d60);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2cb8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2cf0);
  std::function<void_()>::~function(&local_2c78);
  Transducer::BasicFst<wchar_t>::Vertex::~Vertex(&local_2c58);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2be8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2c20);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2b78);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2bb0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2b08);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2b40);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2a98);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2ad0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2a28);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2a60);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_29b8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_29f0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2948);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2980);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_28d8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2910);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2868);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_28a0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_27f8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2830);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2788);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_27c0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2718);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2750);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_26a8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_26e0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2638);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2670);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_25c8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2600);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2558);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2590);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_24e8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2520);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2478);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_24b0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2408);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2440);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2398);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_23d0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2358);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_22e8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2320);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_22a8);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2238);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2270);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_21c8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2200);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2158);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2190);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_20e8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2120);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2078);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_20b0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_2008);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_2040);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_1f98);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_1fd0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_1f28);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_1f60);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_1eb8);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_1ef0);
  std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>::~pair(&local_1e48);
  Transducer::BasicEdge<wchar_t>::~BasicEdge(&local_1e80);
  digitEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  Transducer::BasicEdge<wchar_t>::~BasicEdge((BasicEdge<wchar_t> *)local_358);
  Transducer::BasicEdge<wchar_t>::~BasicEdge((BasicEdge<wchar_t> *)local_298);
  Transducer::BasicEdge<wchar_t>::~BasicEdge((BasicEdge<wchar_t> *)local_238);
  Transducer::BasicEdge<wchar_t>::~BasicEdge((BasicEdge<wchar_t> *)local_118);
  Transducer::BasicEdge<wchar_t>::~BasicEdge
            ((BasicEdge<wchar_t> *)
             &printableEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Transducer::BasicEdge<wchar_t>::~BasicEdge
            ((BasicEdge<wchar_t> *)&miscEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  Transducer::BasicEdge<wchar_t>::~BasicEdge
            ((BasicEdge<wchar_t> *)&spaceEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count
            );
  Transducer::BasicEdge<wchar_t>::~BasicEdge((BasicEdge<wchar_t> *)local_48);
  if ((digitEdge.m_set._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    Transducer::BasicFst<wchar_t>::~BasicFst(in_RDI);
  }
  return in_RDI;
}

Assistant:

Transducer::Fst fst()
    {
        Transducer::Fst result;
        using namespace PDA::Transducer;
        Edge digitEdge = Edge::create(L'0', L'1', L'2', L'3', L'4', L'5', L'6', L'7', L'8', L'9');
        Edge alphaEdge = Edge::create(L'а',L'б',L'в',L'г',L'д',L'е',L'ё',L'ж',L'з',L'и',L'й',L'к',L'л',L'м',L'н',L'о',L'п',L'р',L'с',L'т',L'у',L'ф',L'х',L'ц',L'ч',L'ш',L'щ',L'ь',L'ы',L'ъ',L'э',L'ю',L'я',L'А',L'Б',L'В',L'Г',L'Д',L'Е',L'Ё',L'Ж',L'З',L'И',L'Й',L'К',L'Л',L'М',L'Н',L'О',L'П',L'Р',L'С',L'Т',L'У',L'Ф',L'Х',L'Ц',L'Ч',L'Ш',L'Щ',L'Ь',L'Ы',L'Ъ',L'Э',L'Ю',L'Я',L'a',L'b',L'c',L'd',L'e',L'f',L'g',L'h',L'i',L'j',L'k',L'l',L'm',L'n',L'o',L'p',L'q',L'r',L's',L't',L'u',L'v',L'w',L'x',L'y',L'z',L'A',L'B',L'C',L'D',L'E',L'F',L'G',L'H',L'I',L'J',L'K',L'L',L'M',L'N',L'O',L'P',L'Q',L'R',L'S',L'T',L'U',L'V',L'W',L'X',L'Y',L'Z');
        Edge spaceEdge = Edge::create(L' ', L'_');
        Edge miscEdge = Edge::create(L'~', L'`', L'!', L'#', L'$', L'%', L'^', L'&', L'*', L'(', L')', L'-', L'+', L'=', L'/', L'\\', L'|', L'}', L'{', L'[', L']', L'.', L',', L'?', L'№', ';');
        Edge printableEdge = digitEdge + alphaEdge + spaceEdge + miscEdge;
        Edge hexDigitEdge = digitEdge + Edge::create(L'A', L'B', L'C', L'D', L'E', L'F', L'a', L'b', L'c', L'd', L'e', L'f');
        //абвгдеёжхийглмнопрстуфхцчшщьыъэюяАБВГДЕЁЖХИЙКЛМНОПРСТУФХЦЧШЩЬЫЪЭЮЯabcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ
        Edge alphaDigitSpaceEdge = digitEdge + alphaEdge + Edge::create(L'_');
        Edge alphaSpaceEdge = alphaEdge + Edge::create(L'_');

        result = {
/* 0 */             Fst::Vertex( _(1, Edge::create(L'@')), _(15, Edge::create(L'б')), _(20, Edge::create(L'в')), _(27, Edge::create(L'д')), _(34, Edge::create(L'к')), _(39, Edge::create(L'л')), _(47, Edge::create(L'п')), _(71, Edge::create(L'р')), _(76, Edge::create(L'с')), _(82, Edge::create(L'ц')), _(95, digitEdge), _(98, Edge::create(L'0')), _(101, alphaSpaceEdge), _(102, Edge::create(L'+')), _(103, Edge::create(L'-')), _(104, Edge::create(L'*')), _(105, Edge::create(L'/')), _(106, Edge::create(L'\"') ), _(108, Edge::create(L';')), _(109, Edge::create(L':')), _(110, Edge::create(L'=')), _(112, Edge::create(L'(')), _(113, Edge::create(L')')), _(114, Edge::create(L'<')), _(116, Edge::create('>')), _(118, Edge::create(L',')), _(119, Edge::create(L'%')) )
/* 1 */         ,   Fst::Vertex( _(2, Edge::create(L'н')), _(7, Edge::create(L'у')) )
/* 2 */         ,   Fst::Vertex( _(3, Edge::create(L'у')) )
/* 3 */         ,   Fst::Vertex( _(4, Edge::create(L'м')) )
/* 4 */         ,   Fst::Vertex( _(5, Edge::create(L'а')) )
/* 5 */         ,   Fst::Vertex( _(6, Edge::create(L'р')) )
/* 6 */         ,   Fst::Vertex().setAction([&](){std::wcerr << L"@нумар detected" << std::endl;})
/* 7 */         ,   Fst::Vertex( _(8, Edge::create(L'к')) )
/* 8 */         ,   Fst::Vertex( _(9, Edge::create(L'л')) )
/* 9 */         ,   Fst::Vertex( _(10, Edge::create(L'ю')) )
/*10 */         ,   Fst::Vertex( _(11, Edge::create(L'ч')) )
/*11 */         ,   Fst::Vertex( _(12, Edge::create(L'ы')) )
/*12 */         ,   Fst::Vertex( _(13, Edge::create(L'ц')) )
/*13 */         ,   Fst::Vertex( _(14, Edge::create(L'ь')) )
/*14 */         ,   Fst::Vertex().setAction([&](){std::wcerr << L"@уключыць detected" << std::endl;})
/*15 */         ,   Fst::Vertex( _(16, Edge::create(L'у')) )
/*16 */         ,   Fst::Vertex( _(17, Edge::create(L'д')) )
/*17 */         ,   Fst::Vertex( _(18, Edge::create(L'з')) )
/*18 */         ,   Fst::Vertex( _(19, Edge::create(L'е')) )
/*19 */         ,   Fst::Vertex().setAction([](){ Fst::userData = Constants::varToken; })
/*20 */         ,   Fst::Vertex( _(21, Edge::create(L'я')) )
/*21 */         ,   Fst::Vertex( _(22, Edge::create(L'р')) )
/*22 */         ,   Fst::Vertex( _(23, Edge::create(L'н')) )
/*23 */         ,   Fst::Vertex( _(24, Edge::create(L'у')) )
/*24 */         ,   Fst::Vertex( _(25, Edge::create(L'ц')) )
/*25 */         ,   Fst::Vertex( _(26, Edge::create(L'ь')) )
/*26 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::returnToken;})
/*27 */         ,   Fst::Vertex( _(28, Edge::create(L'р')) )
/*28 */         ,   Fst::Vertex( _(29, Edge::create(L'о')) )
/*29 */         ,   Fst::Vertex( _(30, Edge::create(L'б')) )
/*30 */         ,   Fst::Vertex( _(31, Edge::create(L'н')) )
/*31 */         ,   Fst::Vertex( _(32, Edge::create(L'а')) )
/*32 */         ,   Fst::Vertex( _(33, Edge::create(L'е')) )
/*33 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::typeToken;})
/*34 */         ,   Fst::Vertex( _(35, Edge::create(L'а')) )
/*35 */         ,   Fst::Vertex( _(36, Edge::create(L'н')) )
/*36 */         ,   Fst::Vertex( _(37, Edge::create(L'е')) )
/*37 */         ,   Fst::Vertex( _(38, Edge::create(L'ц')) )
/*38 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::endToken;})
/*39 */         ,   Fst::Vertex( _(40, Edge::create(L'а')) )
/*40 */         ,   Fst::Vertex( _(41, Edge::create(L'г')) )
/*41 */         ,   Fst::Vertex( _(42, Edge::create(L'i')) )
/*42 */         ,   Fst::Vertex( _(43, Edge::create(L'ч')) )
/*43 */         ,   Fst::Vertex( _(44, Edge::create(L'н')) )
/*44 */         ,   Fst::Vertex( _(45, Edge::create(L'а')) )
/*45 */         ,   Fst::Vertex( _(46, Edge::create(L'е')) )
/*46 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::typeToken;})
/*47 */         ,   Fst::Vertex( _(48, Edge::create(L'а')), _(67, Edge::create(L'у')) )
/*48 */         ,   Fst::Vertex( _(49, Edge::create(L'к')), _(56, Edge::create(L'л')), _(62, Edge::create(L'ч')) )
/*49 */         ,   Fst::Vertex( _(50, Edge::create(L'а')), _(53, Edge::create(L'у')) )
/*50 */         ,   Fst::Vertex( _(51, Edge::create(L'ж')) )
/*51 */         ,   Fst::Vertex( _(52, Edge::create(L'ы')) )
/*52 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::printToken;})
/*53 */         ,   Fst::Vertex( _(54, Edge::create(L'л')) )
/*54 */         ,   Fst::Vertex( _(55, Edge::create(L'ь')) )
/*55 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::whileToken;})
/*56 */         ,   Fst::Vertex( _(57, Edge::create(L'а')) )
/*57 */         ,   Fst::Vertex( _(58, Edge::create(L'м')) )
/*58 */         ,   Fst::Vertex( _(59, Edge::create(L'а')) )
/*59 */         ,   Fst::Vertex( _(60, Edge::create(L'ц')) )
/*60 */         ,   Fst::Vertex( _(61, Edge::create(L'ь')) )
/*61 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::breakToken;})
/*62 */         ,   Fst::Vertex( _(63, Edge::create(L'а')) )
/*63 */         ,   Fst::Vertex( _(64, Edge::create(L'т')) )
/*64 */         ,   Fst::Vertex( _(65, Edge::create(L'а')) )
/*65 */         ,   Fst::Vertex( _(66, Edge::create(L'к')) )
/*66 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::mainToken;})
/*67 */         ,   Fst::Vertex( _(68, Edge::create(L'с')) )
/*68 */         ,   Fst::Vertex( _(69, Edge::create(L'т')) )
/*69 */         ,   Fst::Vertex( _(70, Edge::create(L'а')) )
/*70 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::typeToken;})
/*71 */         ,   Fst::Vertex( _(72, Edge::create(L'а')) )
/*72 */         ,   Fst::Vertex( _(73, Edge::create(L'д')) )
/*73 */         ,   Fst::Vertex( _(74, Edge::create(L'о')) )
/*74 */         ,   Fst::Vertex( _(75, Edge::create(L'к')) )
/*75 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::stringToken; Fst::userData_1 = L's';})
/*76 */         ,   Fst::Vertex( _(77, Edge::create(L'п')), _(83, Edge::create(L'т')) )
/*77 */         ,   Fst::Vertex( _(78, Edge::create(L'ы')) )
/*78 */         ,   Fst::Vertex( _(79, Edge::create(L'т')) )
/*79 */         ,   Fst::Vertex( _(80, Edge::create(L'а')) )
/*80 */         ,   Fst::Vertex( _(81, Edge::create(L'й')) )
/*81 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::askToken;})
/*82 */         ,   Fst::Vertex( _(90, Edge::create(L'i')), _(91, Edge::create(L'э')) )
/*83 */         ,   Fst::Vertex( _(84, Edge::create(L'в')) )
/*84 */         ,   Fst::Vertex( _(85, Edge::create(L'а')) )
/*85 */         ,   Fst::Vertex( _(86, Edge::create(L'р')) )
/*86 */         ,   Fst::Vertex( _(87, Edge::create(L'ы')) )
/*87 */         ,   Fst::Vertex( _(88, Edge::create(L'ц')) )
/*88 */         ,   Fst::Vertex( _(89, Edge::create(L'ь')) )
/*89 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::createFunctionToken;})
/*90 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::conditionToken;})
/*91 */         ,   Fst::Vertex( _(92, Edge::create(L'л')) )
/*92 */         ,   Fst::Vertex( _(93, Edge::create(L'а')) )
/*93 */         ,   Fst::Vertex( _(94, Edge::create(L'е')) )
/*94 */         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::typeToken;})
/*95 */         ,   Fst::Vertex( _(95, digitEdge ), _(96, Edge::create(L'.')) ).setAction([&](){Fst::userData = Constants::literalToken; Fst::userData_1 = L'i';})//целый
/*96 */         ,   Fst::Vertex( _(97, digitEdge) )
/*97 */         ,   Fst::Vertex( _(97, digitEdge) ).setAction([&](){Fst::userData = Constants::literalToken; Fst::userData_1 = L'd';})//вещественный
/*98 */         ,   Fst::Vertex( _(99, Edge::create(L'x', L'X')) )
/*99 */         ,   Fst::Vertex( _(100, hexDigitEdge) )
/*100*/         ,   Fst::Vertex( _(100, hexDigitEdge) ).setAction([&](){Fst::userData = Constants::literalToken; Fst::userData_1 = L'i';})//целый
/*101*/         ,   Fst::Vertex( _(101, alphaDigitSpaceEdge) ).setAction([&](){Fst::userData = Constants::identifierToken;})
/*102*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::plusToken;})
/*103*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::minusToken;})
/*104*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::starToken;})
/*105*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::slashToken;})
/*106*/         ,   Fst::Vertex( _(106, printableEdge), _(107, Edge::create(L'\"')) )
/*107*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::literalToken;})//строчный
/*108*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::semicolonToken;})
/*109*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::dotDotToken;})
/*110*/         ,   Fst::Vertex( _(111, Edge::create(L'=')) ).setAction([&](){Fst::userData = Constants::asignmentToken;})
/*111*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::compareToken;})
/*112*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::leftBraceToken;})
/*113*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::rightBraceToken;})
/*114*/         ,   Fst::Vertex( _(115, Edge::create(L'=')) ).setAction([&](){Fst::userData = Constants::lessToken;})
/*115*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::lessOrEqualToken;})
/*116*/         ,   Fst::Vertex( _(117, Edge::create(L'=')) ).setAction([&](){Fst::userData = Constants::greaterToken;})
/*117*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::greaterOrEqualToken;})
/*118*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::commaToken;})
/*119*/         ,   Fst::Vertex().setAction([&](){Fst::userData = Constants::remainderToken;})
        };
        return result;
    }